

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.c
# Opt level: O1

void strip_crlf(char *str)

{
  size_t sVar1;
  char *pcVar2;
  
  sVar1 = strlen(str);
  if (0 < (long)sVar1) {
    pcVar2 = str + sVar1;
    do {
      if ((pcVar2[-1] != '\r') && (pcVar2[-1] != '\n')) {
        return;
      }
      pcVar2 = pcVar2 + -1;
      *pcVar2 = '\0';
    } while (str < pcVar2);
  }
  return;
}

Assistant:

void strip_crlf(char *str)
{
    char *p = str + strlen(str);

    while (p > str && (p[-1] == '\r' || p[-1] == '\n'))
        *--p = '\0';
}